

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

FunctionSignature * __thiscall
Jinx::Impl::Library::CreateFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Library *this,Visibility visibility,
          String *name)

{
  bool bVar1;
  element_type *this_00;
  SymbolTypeMap *symbolTypeMap;
  char *start;
  char *pcVar2;
  size_type sVar3;
  SymbolList *symbolList;
  RuntimeIPtr local_2a68;
  undefined1 local_2a58 [8];
  Parser parser;
  shared_ptr<Jinx::Impl::Runtime> local_a0;
  undefined1 local_90 [8];
  Lexer lexer;
  String *name_local;
  Visibility visibility_local;
  Library *this_local;
  
  lexer.m_symbolTypeMap = (SymbolTypeMap *)name;
  std::weak_ptr<Jinx::Impl::Runtime>::lock((weak_ptr<Jinx::Impl::Runtime> *)&local_a0);
  this_00 = std::__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_a0);
  symbolTypeMap = Runtime::GetSymbolTypeMap(this_00);
  start = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     lexer.m_symbolTypeMap);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                      lexer.m_symbolTypeMap);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     lexer.m_symbolTypeMap);
  Lexer::Lexer((Lexer *)local_90,symbolTypeMap,start,pcVar2 + sVar3,(String *)lexer.m_symbolTypeMap)
  ;
  std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr(&local_a0);
  bVar1 = Lexer::Execute((Lexer *)local_90);
  if (bVar1) {
    std::weak_ptr<Jinx::Impl::Runtime>::lock((weak_ptr<Jinx::Impl::Runtime> *)&local_2a68);
    symbolList = Lexer::GetSymbolList((Lexer *)local_90);
    Parser::Parser((Parser *)local_2a58,&local_2a68,symbolList,(String *)lexer.m_symbolTypeMap);
    std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr(&local_2a68);
    Parser::ParseFunctionSignature
              (__return_storage_ptr__,(Parser *)local_2a58,(visibility == Public) + Private,
               &this->m_name);
    Parser::~Parser((Parser *)local_2a58);
  }
  else {
    FunctionSignature::FunctionSignature(__return_storage_ptr__);
  }
  Lexer::~Lexer((Lexer *)local_90);
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Library::CreateFunctionSignature(Visibility visibility, const String & name) const
	{
		Lexer lexer(m_runtime.lock()->GetSymbolTypeMap(), name.c_str(), name.c_str() + name.size(), name);
		if (!lexer.Execute())
			return FunctionSignature();
		Parser parser(m_runtime.lock(), lexer.GetSymbolList(), name);
		return parser.ParseFunctionSignature(visibility == Visibility::Public ? VisibilityType::Public : VisibilityType::Private, m_name);
	}